

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

stringstream * __thiscall
Assimp::JSONWriter::LiteralToString(JSONWriter *this,stringstream *stream,aiString *s)

{
  ulong local_58;
  size_t i;
  string local_40 [8];
  string t;
  aiString *s_local;
  stringstream *stream_local;
  JSONWriter *this_local;
  
  t.field_2._8_8_ = s;
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::reserve((ulong)local_40);
  for (local_58 = 0; local_58 < *(uint *)t.field_2._8_8_; local_58 = local_58 + 1) {
    if (((*(char *)(t.field_2._8_8_ + 4 + local_58) == '\\') ||
        (*(char *)(t.field_2._8_8_ + 4 + local_58) == '\'')) ||
       (*(char *)(t.field_2._8_8_ + 4 + local_58) == '\"')) {
      std::__cxx11::string::push_back((char)local_40);
    }
    std::__cxx11::string::push_back((char)local_40);
  }
  std::operator<<((ostream *)(stream + 0x10),"\"");
  std::operator<<((ostream *)(stream + 0x10),local_40);
  std::operator<<((ostream *)(stream + 0x10),"\"");
  std::__cxx11::string::~string(local_40);
  return stream;
}

Assistant:

std::stringstream& LiteralToString(std::stringstream& stream, const aiString& s) {
        std::string t;

        // escape backslashes and single quotes, both would render the JSON invalid if left as is
        t.reserve(s.length);
        for (size_t i = 0; i < s.length; ++i) {

            if (s.data[i] == '\\' || s.data[i] == '\'' || s.data[i] == '\"') {
                t.push_back('\\');
            }

            t.push_back(s.data[i]);
        }
        stream << "\"";
        stream << t;
        stream << "\"";
        return stream;
    }